

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.hpp
# Opt level: O2

void __thiscall helics::Filter::~Filter(Filter *this)

{
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Filter_00447698;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->filtOp).
              super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Interface::~Interface(&this->super_Interface);
  return;
}

Assistant:

Filter(Filter&& filt) = default;